

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O0

void undo_perm32(uchar *mat,int *P,int n)

{
  uint uVar1;
  uint uVar2;
  int c;
  int j;
  int i;
  uint32_t *mat_32_ptr;
  uint32_t tmp;
  uint32_t mask_cpy;
  int n_local;
  int *P_local;
  uchar *mat_local;
  
  for (i = n + -1; -1 < i; i = i + -1) {
    for (j = 0; j < n; j = j + 1) {
      uVar2 = -(uint)(j == P[i]);
      for (c = 0; c < n / 0x20; c = c + 1) {
        uVar1 = *(uint *)(mat + (long)((n / 0x20) * i + c) * 4);
        *(uint *)(mat + (long)((n / 0x20) * i + c) * 4) =
             *(uint *)(mat + (long)((n / 0x20) * i + c) * 4) & (uVar2 ^ 0xffffffff) |
             *(uint *)(mat + (long)((n / 0x20) * j + c) * 4) & uVar2;
        *(uint *)(mat + (long)((n / 0x20) * j + c) * 4) =
             *(uint *)(mat + (long)((n / 0x20) * j + c) * 4) & (uVar2 ^ 0xffffffff) | uVar1 & uVar2;
      }
    }
  }
  return;
}

Assistant:

void undo_perm32(unsigned char *mat, int *P, int n)
{
  uint32_t mask_cpy;
  uint32_t tmp;
  uint32_t *mat_32_ptr = (uint32_t*)mat;

  for(int i = n-1; i >= 0; i--)
  {
    for(int j = 0; j < n; j++)
    {
      mask_cpy = (j == P[i]);
      mask_cpy = -mask_cpy;

      for(int c = 0; c < n/32; c++)
      {
        tmp = mat_32_ptr[(n/32)*i + c];
        mat_32_ptr[(n/32)*i + c] = (mat_32_ptr[(n/32)*i + c] & ~mask_cpy) | (mat_32_ptr[(n/32)*j + c] & mask_cpy);
        mat_32_ptr[(n/32)*j + c] = (mat_32_ptr[(n/32)*j + c] & ~mask_cpy) | (tmp & mask_cpy);
      }
    }
  }
}